

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

int __thiscall
google::protobuf::internal::ExtensionSet::GetRepeatedEnum(ExtensionSet *this,int number,int index)

{
  CppType CVar1;
  Extension *pEVar2;
  LogMessage *pLVar3;
  int *piVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x209);
    pLVar3 = LogMessage::operator<<(&local_50,"CHECK failed: extension != nullptr: ");
    pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_51,pLVar3);
    LogMessage::~LogMessage(&local_50);
  }
  if (pEVar2->is_repeated == false) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x20a);
    pLVar3 = LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (REPEATED_FIELD): "
                       );
    LogFinisher::operator=(&local_51,pLVar3);
    LogMessage::~LogMessage(&local_50);
  }
  CVar1 = anon_unknown_26::cpp_type(pEVar2->type);
  if (CVar1 != CPPTYPE_ENUM) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x20a);
    pLVar3 = LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                       );
    LogFinisher::operator=(&local_51,pLVar3);
    LogMessage::~LogMessage(&local_50);
  }
  piVar4 = RepeatedField<int>::Get((pEVar2->field_0).repeated_int32_t_value,index);
  return *piVar4;
}

Assistant:

int ExtensionSet::GetRepeatedEnum(int number, int index) const {
  const Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
  return extension->repeated_enum_value->Get(index);
}